

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O1

vec<3UL,_double> * __thiscall vec<3UL,_double>::normalize(vec<3UL,_double> *this)

{
  double dVar1;
  long lVar2;
  long lVar3;
  vec<3UL,_double> ret;
  double local_28 [4];
  
  dVar1 = dot<3ul,double>(this,this);
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  local_28[2] = this->z;
  local_28[0] = this->x;
  local_28[1] = this->y;
  lVar2 = -1;
  do {
    lVar3 = (ulong)(lVar2 != 0) * 8 + 8;
    if (lVar2 == 1) {
      lVar3 = 0;
    }
    *(double *)((long)local_28 + lVar3) = *(double *)((long)local_28 + lVar3) / dVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 2);
  this->z = local_28[2];
  this->x = local_28[0];
  this->y = local_28[1];
  return this;
}

Assistant:

vec& normalize()
    {
        *this = (*this) / norm();
        return *this;
    }